

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::SetPackedFields(TestPackedTypesLite *message)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedField<int> *this_02;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<unsigned_long> *this_05;
  RepeatedField<int> *this_06;
  RepeatedField<long> *this_07;
  RepeatedField<float> *this_08;
  RepeatedField<double> *this_09;
  RepeatedField<bool> *this_10;
  bool bVar1;
  RepeatedField<int> *this_11;
  
  RepeatedField<int>::Add(&(message->field_0)._impl_.packed_int32_,0x259);
  this = &(message->field_0)._impl_.packed_int64_;
  RepeatedField<long>::Add(this,0x25a);
  this_00 = &(message->field_0)._impl_.packed_uint32_;
  RepeatedField<unsigned_int>::Add(this_00,0x25b);
  this_01 = &(message->field_0)._impl_.packed_uint64_;
  RepeatedField<unsigned_long>::Add(this_01,0x25c);
  this_02 = &(message->field_0)._impl_.packed_sint32_;
  RepeatedField<int>::Add(this_02,0x25d);
  this_03 = &(message->field_0)._impl_.packed_sint64_;
  RepeatedField<long>::Add(this_03,0x25e);
  this_04 = &(message->field_0)._impl_.packed_fixed32_;
  RepeatedField<unsigned_int>::Add(this_04,0x25f);
  this_05 = &(message->field_0)._impl_.packed_fixed64_;
  RepeatedField<unsigned_long>::Add(this_05,0x260);
  this_06 = &(message->field_0)._impl_.packed_sfixed32_;
  RepeatedField<int>::Add(this_06,0x261);
  this_07 = &(message->field_0)._impl_.packed_sfixed64_;
  RepeatedField<long>::Add(this_07,0x262);
  this_08 = &(message->field_0)._impl_.packed_float_;
  RepeatedField<float>::Add(this_08,611.0);
  this_09 = &(message->field_0)._impl_.packed_double_;
  RepeatedField<double>::Add(this_09,612.0);
  this_10 = &(message->field_0)._impl_.packed_bool_;
  RepeatedField<bool>::Add(this_10,true);
  bVar1 = internal::ValidateEnum(5,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
  if (bVar1) {
    this_11 = &(message->field_0)._impl_.packed_enum_;
    RepeatedField<int>::Add(this_11,5);
    RepeatedField<int>::Add(&(message->field_0)._impl_.packed_int32_,0x2bd);
    RepeatedField<long>::Add(this,0x2be);
    RepeatedField<unsigned_int>::Add(this_00,0x2bf);
    RepeatedField<unsigned_long>::Add(this_01,0x2c0);
    RepeatedField<int>::Add(this_02,0x2c1);
    RepeatedField<long>::Add(this_03,0x2c2);
    RepeatedField<unsigned_int>::Add(this_04,0x2c3);
    RepeatedField<unsigned_long>::Add(this_05,0x2c4);
    RepeatedField<int>::Add(this_06,0x2c5);
    RepeatedField<long>::Add(this_07,0x2c6);
    RepeatedField<float>::Add(this_08,711.0);
    RepeatedField<double>::Add(this_09,712.0);
    RepeatedField<bool>::Add(this_10,false);
    bVar1 = internal::ValidateEnum(6,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
    if (bVar1) {
      RepeatedField<int>::Add(this_11,6);
      return;
    }
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnumLite_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
                ,0x3bbc,
                "void proto2_unittest::TestPackedTypesLite::add_packed_enum(::proto2_unittest::ForeignEnumLite)"
               );
}

Assistant:

void TestUtilLite::SetPackedFields(unittest::TestPackedTypesLite* message) {
  message->add_packed_int32(601);
  message->add_packed_int64(602);
  message->add_packed_uint32(603);
  message->add_packed_uint64(604);
  message->add_packed_sint32(605);
  message->add_packed_sint64(606);
  message->add_packed_fixed32(607);
  message->add_packed_fixed64(608);
  message->add_packed_sfixed32(609);
  message->add_packed_sfixed64(610);
  message->add_packed_float(611);
  message->add_packed_double(612);
  message->add_packed_bool(true);
  message->add_packed_enum(unittest::FOREIGN_LITE_BAR);
  // add a second one of each field
  message->add_packed_int32(701);
  message->add_packed_int64(702);
  message->add_packed_uint32(703);
  message->add_packed_uint64(704);
  message->add_packed_sint32(705);
  message->add_packed_sint64(706);
  message->add_packed_fixed32(707);
  message->add_packed_fixed64(708);
  message->add_packed_sfixed32(709);
  message->add_packed_sfixed64(710);
  message->add_packed_float(711);
  message->add_packed_double(712);
  message->add_packed_bool(false);
  message->add_packed_enum(unittest::FOREIGN_LITE_BAZ);
}